

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib554.c
# Opt level: O0

int once(char *URL,_Bool oldstyle)

{
  char *pcVar1;
  undefined4 uVar2;
  char *pcVar3;
  undefined4 uVar4;
  char *local_60;
  WriteThis pooh2;
  WriteThis pooh;
  curl_httppost *lastptr;
  curl_httppost *formpost;
  CURLFORMcode formrc;
  CURLcode res;
  CURL *curl;
  char *pcStack_18;
  _Bool oldstyle_local;
  char *URL_local;
  
  formpost._4_4_ = 0;
  lastptr = (curl_httppost *)0x0;
  pooh.sizeleft = 0;
  pooh2.sizeleft = (size_t)data;
  curl._7_1_ = oldstyle;
  pcStack_18 = URL;
  pooh.readptr = (char *)strlen(data);
  if ((curl._7_1_ & 1) == 0) {
    pcVar3 = "file name 2";
    uVar4 = 0x11;
    formpost._0_4_ =
         curl_formadd(&lastptr,&pooh.sizeleft,1,"sendfile alternative",0x13,&pooh2.sizeleft,0x14,
                      pooh.readptr,0x10,"file name 2",0x11);
  }
  else {
    pcVar3 = "postit2.c";
    uVar4 = 0x11;
    formpost._0_4_ =
         curl_formadd(&lastptr,&pooh.sizeleft,1,"sendfile",0x13,&pooh2.sizeleft,6,pooh.readptr,0x10,
                      "postit2.c",0x11);
  }
  if ((int)formpost != 0) {
    curl_mprintf("curl_formadd(1) = %d\n",(int)formpost);
  }
  local_60 = data;
  pcVar1 = (char *)strlen(data);
  uVar2 = 0x11;
  pooh2.readptr = pcVar1;
  formpost._0_4_ =
       curl_formadd(&lastptr,&pooh.sizeleft,1,"callbackdata",0x13,&local_60,6,pcVar1,0x11,pcVar3,
                    uVar4);
  if ((int)formpost != 0) {
    curl_mprintf("curl_formadd(1) = %d\n",(int)formpost);
  }
  formpost._0_4_ =
       curl_formadd(&lastptr,&pooh.sizeleft,1,"filename",4,"postit2.c",0x11,pcVar1,uVar2);
  if ((int)formpost != 0) {
    curl_mprintf("curl_formadd(2) = %d\n",(int)formpost);
  }
  formpost._0_4_ = curl_formadd(&lastptr,&pooh.sizeleft,1,"submit",4,"send",0x11,pcVar1,uVar2);
  if ((int)formpost != 0) {
    curl_mprintf("curl_formadd(3) = %d\n",(int)formpost);
  }
  formpost._0_4_ =
       curl_formadd(&lastptr,&pooh.sizeleft,1,"somename",0xb,"somefile.txt",0xc,"blah blah",0xd,9,
                    0x11);
  if ((int)formpost != 0) {
    curl_mprintf("curl_formadd(4) = %d\n",(int)formpost);
  }
  _formrc = curl_easy_init();
  if (_formrc == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_formfree(lastptr);
    curl_global_cleanup();
    URL_local._4_4_ = 0x7e;
  }
  else {
    formpost._4_4_ = curl_easy_setopt(_formrc,0x2712,pcStack_18);
    if ((((formpost._4_4_ == 0) &&
         (formpost._4_4_ = curl_easy_setopt(_formrc,0x2f,1), formpost._4_4_ == 0)) &&
        (formpost._4_4_ = curl_easy_setopt(_formrc,0x3c,pooh.readptr), formpost._4_4_ == 0)) &&
       (((formpost._4_4_ = curl_easy_setopt(_formrc,0x4e2c,read_callback), formpost._4_4_ == 0 &&
         (formpost._4_4_ = curl_easy_setopt(_formrc,0x2728,lastptr), formpost._4_4_ == 0)) &&
        ((formpost._4_4_ = curl_easy_setopt(_formrc,0x29,1), formpost._4_4_ == 0 &&
         (formpost._4_4_ = curl_easy_setopt(_formrc,0x2a,1), formpost._4_4_ == 0)))))) {
      formpost._4_4_ = curl_easy_perform(_formrc);
    }
    curl_easy_cleanup(_formrc);
    curl_formfree(lastptr);
    URL_local._4_4_ = formpost._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

static int once(char *URL, bool oldstyle)
{
  CURL *curl;
  CURLcode res=CURLE_OK;
  CURLFORMcode formrc;

  struct curl_httppost *formpost=NULL;
  struct curl_httppost *lastptr=NULL;
  struct WriteThis pooh;
  struct WriteThis pooh2;

  pooh.readptr = data;
  pooh.sizeleft = strlen(data);

  /* Fill in the file upload field */
  if(oldstyle) {
    formrc = curl_formadd(&formpost,
                          &lastptr,
                          CURLFORM_COPYNAME, "sendfile",
                          CURLFORM_STREAM, &pooh,
                          CURLFORM_CONTENTSLENGTH, (long)pooh.sizeleft,
                          CURLFORM_FILENAME, "postit2.c",
                          CURLFORM_END);
  }
  else {
    /* new style */
    formrc = curl_formadd(&formpost,
                          &lastptr,
                          CURLFORM_COPYNAME, "sendfile alternative",
                          CURLFORM_STREAM, &pooh,
                          CURLFORM_CONTENTLEN, (curl_off_t)pooh.sizeleft,
                          CURLFORM_FILENAME, "file name 2",
                          CURLFORM_END);
  }

  if(formrc)
    printf("curl_formadd(1) = %d\n", (int)formrc);

  /* Now add the same data with another name and make it not look like
     a file upload but still using the callback */

  pooh2.readptr = data;
  pooh2.sizeleft = strlen(data);

  /* Fill in the file upload field */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "callbackdata",
                        CURLFORM_STREAM, &pooh2,
                        CURLFORM_CONTENTSLENGTH, (long)pooh2.sizeleft,
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(1) = %d\n", (int)formrc);

  /* Fill in the filename field */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "filename",
#ifdef CURL_DOES_CONVERSIONS
                        /* ASCII representation with escape
                           sequences for non-ASCII platforms */
                        CURLFORM_COPYCONTENTS,
                           "\x70\x6f\x73\x74\x69\x74\x32\x2e\x63",
#else
                        CURLFORM_COPYCONTENTS, "postit2.c",
#endif
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(2) = %d\n", (int)formrc);

  /* Fill in a submit field too */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "submit",
#ifdef CURL_DOES_CONVERSIONS
                        /* ASCII representation with escape
                           sequences for non-ASCII platforms */
                        CURLFORM_COPYCONTENTS, "\x73\x65\x6e\x64",
#else
                        CURLFORM_COPYCONTENTS, "send",
#endif
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(3) = %d\n", (int)formrc);

  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, "somename",
                        CURLFORM_BUFFER, "somefile.txt",
                        CURLFORM_BUFFERPTR, "blah blah",
                        CURLFORM_BUFFERLENGTH, (long)9,
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(4) = %d\n", (int)formrc);

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_formfree(formpost);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Now specify we want to POST data */
  test_setopt(curl, CURLOPT_POST, 1L);

  /* Set the expected POST size */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)pooh.sizeleft);

  /* we want to use our own read function */
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);

  /* send a multi-part formpost */
  test_setopt(curl, CURLOPT_HTTPPOST, formpost);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the formpost chain */
  curl_formfree(formpost);

  return res;
}